

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O3

void golf_data_init(void)

{
  assetsys_error_t aVar1;
  _Bool push_events;
  undefined1 local_9;
  
  golf_thread_timer_init(&_main_thread_timer);
  golf_thread_timer_init(&_data_thread_timer);
  golf_mutex_init(&_loaded_data_lock);
  memset(&_loaded_data,0,0x950);
  _loaded_data.alloc_category = "data";
  golf_mutex_init(&_files_to_load_lock);
  _files_to_load.data = (golf_file_t *)0x0;
  _files_to_load.length = 0;
  _files_to_load.capacity = 0;
  _files_to_load.alloc_category = "data";
  golf_mutex_init(&_seen_files_lock);
  _seen_files.data = (golf_file_t *)0x0;
  _seen_files.length = 0;
  _seen_files.capacity = 0;
  _seen_files.alloc_category = "data";
  golf_mutex_init(&_file_events_lock);
  _file_events.data = (_file_event_t *)0x0;
  _file_events.length = 0;
  _file_events.capacity = 0;
  _file_events.alloc_category = "data";
  golf_mutex_init(&_assetsys_lock);
  _assetsys = assetsys_create((void *)0x0);
  _file_time_map.base = (map_base_t)ZEXT816(0);
  _file_time_map.ref = (uint64_t *)0x0;
  _file_time_map.tmp = 0;
  _file_time_map.alloc_category = "data";
  aVar1 = assetsys_mount(_assetsys,"data",(char *)0x0,0,"/data");
  if (aVar1 != ASSETSYS_SUCCESS) {
    golf_log_error("Unable to mount data, error: %d",(ulong)(uint)aVar1);
  }
  local_9 = 0;
  golf_dir_recurse("data",_golf_data_handle_file,&local_9);
  qsort(_seen_files.data,(long)_seen_files.length,0x920,_file_alpha_cmp);
  golf_thread_create(_golf_data_thread_fn,(void *)0x0,"_golf_data_thread_fn");
  return;
}

Assistant:

void golf_data_init(void) {
    golf_thread_timer_init(&_main_thread_timer);
    golf_thread_timer_init(&_data_thread_timer);
    golf_mutex_init(&_loaded_data_lock);
    map_init(&_loaded_data, "data");
    golf_mutex_init(&_files_to_load_lock);
    vec_init(&_files_to_load, "data");
    golf_mutex_init(&_seen_files_lock);
    vec_init(&_seen_files, "data");
    golf_mutex_init(&_file_events_lock);
    vec_init(&_file_events, "data");
    golf_mutex_init(&_assetsys_lock);
    _assetsys = assetsys_create(NULL);
    map_init(&_file_time_map, "data");
#if GOLF_PLATFORM_IOS | GOLF_PLATFORM_ANDROID | GOLF_PLATFORM_EMSCRIPTEN
    assetsys_error_t error = assetsys_mount(_assetsys, "data.zip", (const char*)golf_data_zip, sizeof(golf_data_zip), "/data");
#else
    assetsys_error_t error = assetsys_mount(_assetsys, "data", NULL, 0, "/data");
#endif
    if (error != ASSETSYS_SUCCESS) {
        golf_log_error("Unable to mount data, error: %d", (int)error);
    }

    bool push_events = false;
    golf_dir_recurse("data", _golf_data_handle_file, &push_events); 
    qsort(_seen_files.data, _seen_files.length, sizeof(golf_file_t), _file_alpha_cmp);

    golf_thread_create(_golf_data_thread_fn, NULL, "_golf_data_thread_fn");
}